

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int __thiscall iqnet::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  SystemSockAddrIn *__addr_00;
  int *piVar2;
  network_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  __addr_00 = Inet_addr::get_sockaddr((Inet_addr *)CONCAT44(in_register_00000034,__fd));
  iVar1 = ::connect(this->sock,(sockaddr *)__addr_00,0x10);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x73) {
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Socket::connect",&local_39);
      network_error::network_error(this_00,&local_38,true,0);
      __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  boost::shared_ptr<iqnet::Inet_addr::Impl>::operator=
            (&(this->peer).impl_,&((Inet_addr *)CONCAT44(in_register_00000034,__fd))->impl_);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != -1);
}

Assistant:

bool Socket::connect( const iqnet::Inet_addr& peer_addr )
{
  const sockaddr* saddr = reinterpret_cast<const sockaddr*>(peer_addr.get_sockaddr());

  int code = ::connect(sock, saddr, sizeof(sockaddr_in));
  bool wouldblock = false;

  if( code == -1 ) {
#ifndef WIN32
    wouldblock = errno == EINPROGRESS;
#else
    wouldblock = get_last_error() == WSAEWOULDBLOCK;
#endif

    if (!wouldblock)
      throw network_error( "Socket::connect" );
  }

  peer = peer_addr;
  return !wouldblock;
}